

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> * __thiscall
SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
          (SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *this
          ,short bits)

{
  if (bits < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17a9,
                  "SafeInt<T, E> &SafeInt<char>::operator>>=(U) [T = char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = short]"
                 );
  }
  if (bits < 8) {
    *this = SUB41((int)(char)*this >> ((byte)bits & 0x1f),0);
    return (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
           this;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17aa,
                "SafeInt<T, E> &SafeInt<char>::operator>>=(U) [T = char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = short]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= bits;
        return *this;
    }